

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<(anonymous_namespace)::Version> * __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::
Bind<(anonymous_namespace)::Version,int,std::function<cmCTestResourceSpec::ReadFileResult(int&,Json::Value_const*)>>
          (Object<(anonymous_namespace)::Version> *this,string_view *name,
          offset_in_Version_to_int member,
          function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)> *func,
          bool required)

{
  Object<(anonymous_namespace)::Version> *pOVar1;
  anon_class_40_2_315d8239 local_78;
  MemberFunction local_50;
  byte local_29;
  function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)> *pfStack_28;
  bool required_local;
  function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)> *func_local;
  offset_in_Version_to_int member_local;
  string_view *name_local;
  Object<(anonymous_namespace)::Version> *this_local;
  
  local_29 = required;
  pfStack_28 = func;
  func_local = (function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)> *)member;
  member_local = (offset_in_Version_to_int)name;
  name_local = (string_view *)this;
  std::function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)>::function
            (&local_78.func,func);
  local_78.member = (offset_in_Version_to_int)func_local;
  std::
  function<cmCTestResourceSpec::ReadFileResult((anonymous_namespace)::Version&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Bind<(anonymous_namespace)::Version,int,std::function<cmCTestResourceSpec::ReadFileResult(int&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,int(anonymous_namespace)::Version::*,std::function<cmCTestResourceSpec::ReadFileResult(int&,Json::Value_const*)>,bool)::_lambda((anonymous_namespace)::Version&,Json::Value_const*)_1_,void>
            ((function<cmCTestResourceSpec::ReadFileResult((anonymous_namespace)::Version&,Json::Value_const*)>
              *)&local_50,&local_78);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::
  function<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*)>
  ::~function(&local_50);
  Bind<(anonymous_namespace)::Version,int,std::function<cmCTestResourceSpec::ReadFileResult(int&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,int(anonymous_namespace)::Version::*,std::function<cmCTestResourceSpec::ReadFileResult(int&,Json::Value_const*)>,bool)
  ::{lambda((anonymous_namespace)::Version&,Json::Value_const*)#1}::~basic_string_view
            ((_lambda__anonymous_namespace___Version__Json__Value_const___1_ *)&local_78);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }